

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_bf16_t ggml_fp32_to_bf16(float x)

{
  ggml_bf16_t gVar1;
  float in_XMM0_Da;
  
  gVar1 = ggml_compute_fp32_to_bf16(in_XMM0_Da);
  return (ggml_bf16_t)gVar1.bits;
}

Assistant:

ggml_bf16_t ggml_fp32_to_bf16(float x) {
#define ggml_fp32_to_bf16 do_not_use__ggml_fp32_to_bf16__in_ggml
    return GGML_FP32_TO_BF16(x);
}